

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7314::RtMidi_seterrorcallback(lua_State *L)

{
  _Base_ptr p_Var1;
  int iVar2;
  mapped_type mVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  _Base_ptr local_50;
  pair<RtMidi_*,_lua_State_*> local_48;
  _Rb_tree_iterator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_> local_38;
  iterator it;
  pair<RtMidi_*,_lua_State_*> local_28;
  _Base_ptr local_18;
  RtMidi *self;
  lua_State *L_local;
  
  self = (RtMidi *)L;
  local_18 = (_Base_ptr)getRtMidi(L,1);
  iVar2 = lua_type(self,2);
  if (iVar2 < 1) {
    RtMidi_init((RtMidi *)local_18,(lua_State *)self,1);
  }
  else {
    lua_pushvalue(self,2);
    lua_pushvalue(self,3);
    lua_pushcclosure(self,RtMidi_callbackwrapper,2);
    mVar3 = luaL_ref(self,0xffffd8f0);
    it._M_node = local_18;
    std::pair<RtMidi_*,_lua_State_*>::pair<RtMidi_*,_lua_State_*&,_true>
              (&local_28,(RtMidi **)&it,(lua_State **)&self);
    pmVar4 = std::
             map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
             ::operator[]((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                           *)(anonymous_namespace)::RtMidi_callbacks,&local_28);
    *pmVar4 = mVar3;
    local_50 = local_18;
    std::pair<RtMidi_*,_lua_State_*>::pair<RtMidi_*,_lua_State_*&,_true>
              (&local_48,(RtMidi **)&local_50,(lua_State **)&self);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
         ::find((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                 *)(anonymous_namespace)::RtMidi_callbacks,&local_48);
    p_Var1 = local_18;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>::
             operator->(&local_38);
    (**(code **)(*(long *)p_Var1 + 0x30))(p_Var1,RtMidiCustomErrorCallback,ppVar5);
  }
  return 0;
}

Assistant:

int RtMidi_seterrorcallback(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	if (lua_isnoneornil(L, 2))
		RtMidi_init(self, L, 1);
	else {
		lua_pushvalue(L, 2);
		lua_pushvalue(L, 3);
		lua_pushcclosure(L, RtMidi_callbackwrapper, 2);
		RtMidi_callbacks[{&self, L}] = luaL_ref(L, LUA_REGISTRYINDEX);
		auto it = RtMidi_callbacks.find({&self, L});
		self.setErrorCallback(RtMidiCustomErrorCallback,
		 static_cast<void *>(const_cast<RtMidi_callback_rec *>(&it->first)));

//		lua_pushlightuserdata(L, &REGISTRY_CALLBACK_ENABLED);
//		lua_rawget(L, LUA_REGISTRYINDEX);
//		lua_pushvalue(L, 1);
//		lua_pushboolean(L, true);
//		lua_rawset(L, -3);
//		lua_pop(L, 1);
	}
	return 0;
}